

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipcconn.c
# Opt level: O1

int nni_posix_ipc_alloc(nni_ipc_conn **cp,nni_sockaddr *sa,nni_ipc_dialer *d,int fd)

{
  int iVar1;
  nni_ipc_conn *arg;
  
  arg = (nni_ipc_conn *)nni_zalloc(0x170);
  if (arg == (nni_ipc_conn *)0x0) {
    iVar1 = 2;
  }
  else {
    arg->closed = false;
    arg->dialer = d;
    (arg->stream).s_free = ipc_free;
    (arg->stream).s_close = ipc_close;
    (arg->stream).s_stop = ipc_stop;
    (arg->stream).s_send = ipc_send;
    (arg->stream).s_recv = ipc_recv;
    (arg->stream).s_get = ipc_get;
    (arg->stream).s_set = ipc_set;
    memcpy(&arg->sa,sa,0x88);
    nni_mtx_init(&arg->mtx);
    nni_aio_list_init(&arg->readq);
    nni_aio_list_init(&arg->writeq);
    nni_posix_pfd_init(&arg->pfd,fd,ipc_cb,arg);
    *cp = arg;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nni_posix_ipc_alloc(
    nni_ipc_conn **cp, nni_sockaddr *sa, nni_ipc_dialer *d, int fd)
{
	ipc_conn *c;

	if ((c = NNI_ALLOC_STRUCT(c)) == NULL) {
		return (NNG_ENOMEM);
	}

	c->closed         = false;
	c->dialer         = d;
	c->stream.s_free  = ipc_free;
	c->stream.s_close = ipc_close;
	c->stream.s_stop  = ipc_stop;
	c->stream.s_send  = ipc_send;
	c->stream.s_recv  = ipc_recv;
	c->stream.s_get   = ipc_get;
	c->stream.s_set   = ipc_set;
	c->sa             = *sa;

	nni_mtx_init(&c->mtx);
	nni_aio_list_init(&c->readq);
	nni_aio_list_init(&c->writeq);
	nni_posix_pfd_init(&c->pfd, fd, ipc_cb, c);

	*cp = c;
	return (0);
}